

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O1

void __thiscall ASDCP::MXF::Preface::Preface(Preface *this,Preface *rhs)

{
  _Rb_tree_header *p_Var1;
  Dictionary *pDVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  InterchangeObject *pIVar6;
  UL *pUVar7;
  UUID *pUVar8;
  
  pDVar2 = (rhs->super_InterchangeObject).m_Dict;
  (this->super_InterchangeObject).super_KLVPacket.m_KeyStart = (byte_t *)0x0;
  (this->super_InterchangeObject).super_KLVPacket.m_KLLength = 0;
  pIVar6 = &this->super_InterchangeObject;
  (pIVar6->super_KLVPacket).m_UL.super_Identifier<16U>.m_HasValue = false;
  (pIVar6->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[0] = '\0';
  (pIVar6->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[1] = '\0';
  (pIVar6->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[2] = '\0';
  (pIVar6->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[3] = '\0';
  (pIVar6->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[4] = '\0';
  (pIVar6->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[5] = '\0';
  (pIVar6->super_KLVPacket).m_UL.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar7 = &(this->super_InterchangeObject).super_KLVPacket.m_UL;
  (pUVar7->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->super_InterchangeObject).super_KLVPacket.m_ValueStart = (byte_t *)0x0;
  (this->super_InterchangeObject).super_KLVPacket.m_ValueLength = 0;
  (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.super_IArchive.
  _vptr_IArchive = (_func_int **)&PTR__IArchive_0021f038;
  (this->super_InterchangeObject).m_Dict = pDVar2;
  (this->super_InterchangeObject).m_Lookup = (IPrimerLookup *)0x0;
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_HasValue = false;
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[0] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[1] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[2] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[3] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[4] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[5] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar8 = &(this->super_InterchangeObject).InstanceUID;
  (pUVar8->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->super_InterchangeObject).InstanceUID.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00223d80;
  pIVar6 = &this->super_InterchangeObject;
  (pIVar6->GenerationUID).m_property.super_Identifier<16U>.m_HasValue = false;
  (pIVar6->GenerationUID).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (pIVar6->GenerationUID).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (pIVar6->GenerationUID).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (pIVar6->GenerationUID).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (pIVar6->GenerationUID).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (pIVar6->GenerationUID).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (pIVar6->GenerationUID).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar8 = &(this->super_InterchangeObject).GenerationUID.m_property;
  (pUVar8->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->super_InterchangeObject).GenerationUID.m_property.super_Identifier<16U>.m_Value[0xf] = '\0'
  ;
  (this->super_InterchangeObject).GenerationUID.m_property.super_Identifier<16U>.super_IArchive.
  _vptr_IArchive = (_func_int **)&PTR__IArchive_00223d80;
  (this->super_InterchangeObject).GenerationUID.m_has_value = false;
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Preface_00223fa8;
  Kumu::Timestamp::Timestamp(&this->LastModifiedDate);
  (this->ObjectModelVersion).m_has_value = false;
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_HasValue = false;
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar8 = &(this->PrimaryPackage).m_property;
  (pUVar8->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->PrimaryPackage).m_property.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00223d80;
  (this->PrimaryPackage).m_has_value = false;
  (this->Identifications).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Identifications).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Identifications).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
  super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Identifications).
  super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>.
  super_IArchive._vptr_IArchive = (_func_int **)&PTR__FixedSizeItemCollection_00224928;
  (this->ContentStorage).super_Identifier<16U>.m_HasValue = false;
  (this->ContentStorage).super_Identifier<16U>.m_Value[0] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[1] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[2] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[3] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[4] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[5] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar8 = &this->ContentStorage;
  (pUVar8->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar8->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->ContentStorage).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->ContentStorage).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00223d80;
  (this->OperationalPattern).super_Identifier<16U>.m_HasValue = false;
  (this->OperationalPattern).super_Identifier<16U>.m_Value[0] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[1] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[2] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[3] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[4] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[5] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar7 = &this->OperationalPattern;
  (pUVar7->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar7->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->OperationalPattern).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021f038;
  p_Var1 = &(this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>
            .super_PushSet<ASDCP::UL>.
            super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
            super__Rb_tree_header;
  (this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>._vptr_PushSet = (_func_int **)&PTR__FixedSizeItemCollection_002245d8;
  (this->EssenceContainers).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_IArchive._vptr_IArchive = (_func_int **)&PTR__Batch_00224618;
  p_Var1 = &(this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
            super_PushSet<ASDCP::UL>.
            super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
            super__Rb_tree_header;
  (this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>.super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>.
  _M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
  super_PushSet<ASDCP::UL>._vptr_PushSet = (_func_int **)&PTR__FixedSizeItemCollection_002245d8;
  (this->DMSchemes).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_IArchive.
  _vptr_IArchive = (_func_int **)&PTR__Batch_00224618;
  p_Var1 = &(this->ApplicationSchemes).m_property.
            super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
            super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
            super__Rb_tree_header;
  (this->ApplicationSchemes).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ApplicationSchemes).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ApplicationSchemes).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ApplicationSchemes).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ApplicationSchemes).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  (this->ApplicationSchemes).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  _vptr_PushSet = (_func_int **)&PTR__FixedSizeItemCollection_002245d8;
  (this->ApplicationSchemes).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__Batch_00224618;
  (this->ApplicationSchemes).m_has_value = false;
  p_Var1 = &(this->ConformsToSpecifications).m_property.
            super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
            super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
            super__Rb_tree_header;
  (this->ConformsToSpecifications).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ConformsToSpecifications).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ConformsToSpecifications).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ConformsToSpecifications).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ConformsToSpecifications).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  (this->ConformsToSpecifications).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_PushSet<ASDCP::UL>.
  _vptr_PushSet = (_func_int **)&PTR__FixedSizeItemCollection_002245d8;
  (this->ConformsToSpecifications).m_property.
  super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__Batch_00224618;
  (this->ConformsToSpecifications).m_has_value = false;
  if ((this->super_InterchangeObject).m_Dict != (Dictionary *)0x0) {
    (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue =
         (rhs->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue;
    uVar3 = *(undefined4 *)
             ((rhs->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 4)
    ;
    uVar4 = *(undefined4 *)
             ((rhs->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8)
    ;
    uVar5 = *(undefined4 *)
             ((rhs->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value +
             0xc);
    *(undefined4 *)
     (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value =
         *(undefined4 *)
          (rhs->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value;
    *(undefined4 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 4) =
         uVar3;
    *(undefined4 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) =
         uVar4;
    *(undefined4 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 0xc) =
         uVar5;
    (*(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket[0x12])(this,rhs);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x271,"ASDCP::MXF::Preface::Preface(const Preface &)");
}

Assistant:

ASDCP::MXF::Preface::Preface(const Preface& rhs) : InterchangeObject(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = rhs.m_UL;
  Copy(rhs);
}